

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endianness.hh
# Opt level: O0

bool __thiscall Typelib::EndianSwapVisitor::visit_(EndianSwapVisitor *this,Value *v,Pointer *t)

{
  UnsupportedEndianSwap *this_00;
  allocator local_41;
  string local_40 [32];
  Pointer *local_20;
  Pointer *t_local;
  Value *v_local;
  EndianSwapVisitor *this_local;
  
  local_20 = t;
  t_local = (Pointer *)v;
  v_local = (Value *)this;
  this_00 = (UnsupportedEndianSwap *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"pointers",&local_41);
  UnsupportedEndianSwap::UnsupportedEndianSwap(this_00,(string *)local_40);
  __cxa_throw(this_00,&UnsupportedEndianSwap::typeinfo,UnsupportedEndianSwap::~UnsupportedEndianSwap
             );
}

Assistant:

bool visit_ (Value const& v, Pointer const& t) { throw UnsupportedEndianSwap("pointers"); }